

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersTests.cpp
# Opt level: O2

bool deqp::egl::anon_unknown_4::checkColor(TestLog *log,TextureLevel *screen,Vec4 *color)

{
  ostringstream *this;
  TestLog *pTVar1;
  bool bVar2;
  ConstPixelBufferAccess *access;
  void *__buf;
  int y;
  int z;
  allocator<char> local_256;
  allocator<char> local_255;
  int local_254;
  TestLog *local_250;
  Vector<float,_4> local_248;
  string local_238;
  string local_218;
  Vec4 diff;
  Vec4 pixel;
  ConstPixelBufferAccess local_1d8;
  MessageBuilder local_1b0;
  
  local_248.m_data[0] = 0.01;
  local_248.m_data[1] = 0.01;
  local_248.m_data[2] = 0.01;
  local_248.m_data[3] = 1.0;
  z = 0;
  local_250 = log;
  do {
    local_254 = (screen->m_size).m_data[1];
    if (local_254 <= z) {
LAB_00214421:
      return local_254 <= z;
    }
    for (y = 0; y < (screen->m_size).m_data[0]; y = y + 1) {
      tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)&local_1b0,screen);
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&pixel,(int)&local_1b0,y,z);
      tcu::operator-((tcu *)&local_1b0,(Vector<float,_4> *)&pixel,color);
      tcu::abs<float,4>((tcu *)&diff,(Vector<float,_4> *)&local_1b0);
      tcu::lessThanEqual<float,4>((tcu *)&local_1b0,(Vector<float,_4> *)&diff,&local_248);
      bVar2 = tcu::boolAll<4>((Vector<bool,_4> *)&local_1b0);
      pTVar1 = local_250;
      if (!bVar2) {
        this = &local_1b0.m_str;
        local_1b0.m_log = local_250;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
        std::operator<<((ostream *)this,"Unexpected color values read from screen expected: ");
        tcu::operator<<((ostream *)this,color);
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"Screen",&local_255)
        ;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"Screen",&local_256)
        ;
        tcu::TextureLevel::getAccess(&local_1d8,screen);
        access = &local_1d8;
        tcu::LogImage::LogImage
                  ((LogImage *)&local_1b0,&local_218,&local_238,access,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&local_1b0,(int)pTVar1,__buf,(size_t)access);
        tcu::LogImage::~LogImage((LogImage *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_218);
        goto LAB_00214421;
      }
    }
    z = z + 1;
  } while( true );
}

Assistant:

bool checkColor (tcu::TestLog& log, const tcu::TextureLevel& screen, const tcu::Vec4& color)
{
	const tcu::Vec4 threshold(0.01f, 0.01f, 0.01f, 1.00f);

	for (int y = 0; y < screen.getHeight(); y++)
	{
		for (int x = 0; x < screen.getWidth(); x++)
		{
			const tcu::Vec4	pixel(screen.getAccess().getPixel(x, y));
			const tcu::Vec4	diff(abs(pixel - color));

			if (!boolAll(lessThanEqual(diff, threshold)))
			{
				log << TestLog::Message << "Unexpected color values read from screen expected: " << color << TestLog::EndMessage;
				log << TestLog::Image("Screen", "Screen", screen.getAccess());
				return false;
			}
		}
	}

	return true;
}